

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O3

gme_type_t gme_identify_extension(char *extension_)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  gme_type_t pgVar4;
  char *pcVar5;
  gme_type_t *ppgVar6;
  char extension [6];
  char local_1e [6];
  
  pcVar2 = strrchr(extension_,0x2e);
  pcVar5 = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = extension_;
  }
  lVar3 = 0;
  do {
    iVar1 = toupper((int)pcVar5[lVar3]);
    local_1e[lVar3] = (char)iVar1;
    if ((char)iVar1 == '\0') goto LAB_00577447;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  local_1e[0] = '\0';
LAB_00577447:
  gme_type_list();
  if (gme_type_list::gme_type_list_[0] != (gme_type_t)0x0) {
    ppgVar6 = gme_type_list::gme_type_list_;
    pgVar4 = gme_type_list::gme_type_list_[0];
    do {
      ppgVar6 = ppgVar6 + 1;
      iVar1 = strcmp(local_1e,pgVar4->extension_);
      if (iVar1 == 0) {
        return pgVar4;
      }
      pgVar4 = *ppgVar6;
    } while (pgVar4 != (gme_type_t)0x0);
  }
  return (gme_type_t)0x0;
}

Assistant:

BLARGG_EXPORT gme_type_t gme_identify_extension( const char* extension_ )
{
	char const* end = strrchr( extension_, '.' );
	if ( end )
		extension_ = end + 1;
	
	char extension [6];
	to_uppercase( extension_, sizeof extension, extension );
	
	for ( gme_type_t const* types = gme_type_list(); *types; types++ )
		if ( !strcmp( extension, (*types)->extension_ ) )
			return *types;
	return 0;
}